

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeavyRowGenerator.cpp
# Opt level: O0

void __thiscall OffsetCauchyMatrixParams::FillMatrix(OffsetCauchyMatrixParams *this,uint8_t *matrix)

{
  uint8_t C_ij;
  uint8_t Y_j;
  uint8_t X_i;
  uint j;
  uint i;
  uint8_t *matrix_local;
  OffsetCauchyMatrixParams *this_local;
  
  for (i = 0; i < 0x12; i = i + 1) {
    for (j = 0; j < 6; j = j + 1) {
      matrix[j * 0x12 + i] =
           GF256Ctx.GF256_INV_TABLE
           [(byte)((char)this->ColWiggle + (char)i + (char)this->Rows ^
                  (char)this->RowWiggle + (char)j)];
    }
  }
  return;
}

Assistant:

void FillMatrix(uint8_t* matrix)
    {
        for (unsigned i = 0; i < kColumns; ++i)
        {
            for (unsigned j = 0; j < kRows; ++j)
            {
                // Cauchy matrix elements:
                // C_ij = 1 / (X_i - Y_j)

                SIAMESE_DEBUG_ASSERT(ColWiggle + i + Rows < 256);
                const uint8_t X_i = (uint8_t)(ColWiggle + i + Rows);

                SIAMESE_DEBUG_ASSERT(RowWiggle + j < Rows);
                const uint8_t Y_j = (uint8_t)(RowWiggle + j);

                const uint8_t C_ij = gf256_inv(X_i ^ Y_j);

                matrix[j * kColumns + i] = C_ij;
            }
        }
    }